

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

bool __thiscall ASDCP::UL::operator==(UL *this,UL *rhs)

{
  UL *rhs_local;
  UL *this_local;
  
  if ((((((this->super_Identifier<16U>).m_Value[0] == (rhs->super_Identifier<16U>).m_Value[0]) &&
        ((this->super_Identifier<16U>).m_Value[1] == (rhs->super_Identifier<16U>).m_Value[1])) &&
       ((this->super_Identifier<16U>).m_Value[2] == (rhs->super_Identifier<16U>).m_Value[2])) &&
      ((((this->super_Identifier<16U>).m_Value[3] == (rhs->super_Identifier<16U>).m_Value[3] &&
        ((this->super_Identifier<16U>).m_Value[4] == (rhs->super_Identifier<16U>).m_Value[4])) &&
       (((this->super_Identifier<16U>).m_Value[5] == (rhs->super_Identifier<16U>).m_Value[5] &&
        (((this->super_Identifier<16U>).m_Value[6] == (rhs->super_Identifier<16U>).m_Value[6] &&
         ((this->super_Identifier<16U>).m_Value[8] == (rhs->super_Identifier<16U>).m_Value[8])))))))
      ) && (((this->super_Identifier<16U>).m_Value[9] == (rhs->super_Identifier<16U>).m_Value[9] &&
            ((((((this->super_Identifier<16U>).m_Value[10] ==
                 (rhs->super_Identifier<16U>).m_Value[10] &&
                ((this->super_Identifier<16U>).m_Value[0xb] ==
                 (rhs->super_Identifier<16U>).m_Value[0xb])) &&
               ((this->super_Identifier<16U>).m_Value[0xc] ==
                (rhs->super_Identifier<16U>).m_Value[0xc])) &&
              (((this->super_Identifier<16U>).m_Value[0xd] ==
                (rhs->super_Identifier<16U>).m_Value[0xd] &&
               ((this->super_Identifier<16U>).m_Value[0xe] ==
                (rhs->super_Identifier<16U>).m_Value[0xe])))) &&
             ((this->super_Identifier<16U>).m_Value[0xf] ==
              (rhs->super_Identifier<16U>).m_Value[0xf])))))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
ASDCP::UL::operator==(const UL& rhs) const
{
  if ( m_Value[0] == rhs.m_Value[0] &&
       m_Value[1] == rhs.m_Value[1] &&
       m_Value[2] == rhs.m_Value[2] &&
       m_Value[3] == rhs.m_Value[3] &&
       m_Value[4] == rhs.m_Value[4] &&
       m_Value[5] == rhs.m_Value[5] &&
       m_Value[6] == rhs.m_Value[6] &&
       //       m_Value[7] == rhs.m_Value[7] &&  // version is ignored when performing lookups
       m_Value[8] == rhs.m_Value[8] &&
       m_Value[9] == rhs.m_Value[9] &&
       m_Value[10] == rhs.m_Value[10] &&
       m_Value[11] == rhs.m_Value[11] &&
       m_Value[12] == rhs.m_Value[12] &&
       m_Value[13] == rhs.m_Value[13] &&
       m_Value[14] == rhs.m_Value[14] &&
       m_Value[15] == rhs.m_Value[15]
       )
    return true;

  return false;
}